

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

void mjs::run_test_spec(string_view *source_text,string_view *name)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  size_type sVar5;
  type statements;
  size_t sVar6;
  runtime_error *prVar7;
  wostream *pwVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  string_view sVar10;
  wstring local_5b8 [32];
  wstring_view local_598;
  allocator<wchar_t> local_581;
  wstring local_580 [32];
  wostringstream local_560 [8];
  wostringstream oss;
  string local_3e0;
  string local_3c0;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  size_t local_2b8;
  size_t index;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> bs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_23a;
  allocator<char> local_239;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  string_view local_228;
  string local_218;
  value_type local_1f8;
  undefined1 local_1b0 [8];
  source_extend extend;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  size_type local_130;
  size_t delim_pos;
  size_t next_pos;
  size_t pos;
  wstring local_110 [55];
  allocator<wchar_t> local_d9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  undefined1 local_b8 [8];
  shared_ptr<mjs::source_file> file;
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> specs;
  gc_heap heap;
  int delim_len;
  char delim [4];
  string_view *name_local;
  string_view *source_text_local;
  
  heap.gc_state_.weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x242f2f;
  heap.gc_state_.weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
  gc_heap::gc_heap((gc_heap *)
                   &specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,0x100000);
  std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::vector
            ((vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
             &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(name);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(name);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<char_const*,void>((wstring *)&local_d8,pvVar3,pvVar4,&local_d9);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(source_text);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(source_text);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<char_const*,void>
            (local_110,pvVar3,pvVar4,(allocator<wchar_t> *)((long)&pos + 7));
  pos._0_4_ = tested_version();
  std::make_shared<mjs::source_file,std::__cxx11::wstring,std::__cxx11::wstring,mjs::version>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_b8,
             &local_d8,(version *)local_110);
  std::__cxx11::wstring::~wstring(local_110);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&pos + 7));
  std::__cxx11::wstring::~wstring((wstring *)&local_d8);
  std::allocator<wchar_t>::~allocator(&local_d9);
  next_pos = 0;
  do {
    sVar6 = next_pos;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::length(source_text);
    if (sVar5 <= sVar6) {
LAB_00119d34:
      bVar1 = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::empty
                        ((vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
                         &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        bs._M_t.
        super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>._M_t
        .super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>.
        super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl._6_1_ = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_2a0,name,
                   (allocator<char> *)
                   ((long)&bs._M_t.
                           super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>
                           .super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl + 7));
        std::operator+(&local_280,"Invalid test spec.",&local_2a0);
        std::operator+(&local_260,&local_280,": No specs found");
        std::runtime_error::runtime_error(prVar7,(string *)&local_260);
        bs._M_t.
        super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>._M_t
        .super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>.
        super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl._6_1_ = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      parse((mjs *)&index,(shared_ptr<mjs::source_file> *)local_b8,non_strict);
      statements = std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
                   ::operator*((unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
                                *)&index);
      sVar6 = test_spec_runner::run
                        ((gc_heap *)
                         &specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
                         &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,statements);
      local_2b8 = sVar6;
      sVar5 = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::size
                        ((vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
                         &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (sVar6 != sVar5) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_398,name,&local_399);
        std::operator+(&local_378,"Invalid test spec.",&local_398);
        std::operator+(&local_358,&local_378,": Only ");
        std::__cxx11::to_string(&local_3c0,local_2b8);
        std::operator+(&local_338,&local_358,&local_3c0);
        std::operator+(&local_318,&local_338," of ");
        sVar5 = std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::size
                          ((vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
                           &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        std::__cxx11::to_string(&local_3e0,sVar5);
        std::operator+(&local_2f8,&local_318,&local_3e0);
        std::operator+(&local_2d8,&local_2f8," specs ran");
        std::runtime_error::runtime_error(prVar7,(string *)&local_2d8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::~unique_ptr
                ((unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> *)
                 &index);
      std::shared_ptr<mjs::source_file>::~shared_ptr((shared_ptr<mjs::source_file> *)local_b8);
      std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::~vector
                ((vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
                 &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      gc_heap::garbage_collect
                ((gc_heap *)
                 &specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      iVar2 = gc_heap::use_percentage
                        ((gc_heap *)
                         &specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar2 != 0) {
        std::__cxx11::wostringstream::wostringstream(local_560);
        pwVar8 = std::operator<<((wostream *)local_560,"Leaks in test spec: ");
        iVar2 = gc_heap::use_percentage
                          ((gc_heap *)
                           &specs.
                            super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        pwVar8 = (wostream *)std::wostream::operator<<(pwVar8,iVar2);
        pwVar8 = std::operator<<(pwVar8,"%\n");
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin(source_text);
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end(source_text);
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<char_const*,void>(local_580,pvVar3,pvVar4,&local_581);
        std::operator<<(pwVar8,local_580);
        std::__cxx11::wstring::~wstring(local_580);
        std::allocator<wchar_t>::~allocator(&local_581);
        std::__cxx11::wostringstream::str();
        local_598 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view(local_5b8);
        throw_runtime_error(&local_598,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_spec.cpp"
                            ,0x10a);
      }
      gc_heap::~gc_heap((gc_heap *)
                        &specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    local_130 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (source_text,
                           (char *)((long)&heap.gc_state_.weak_fixups.
                                           super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                           next_pos);
    if (local_130 == 0xffffffffffffffff) {
      local_130 = 0xffffffffffffffff;
      goto LAB_00119d34;
    }
    delim_pos = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (source_text,"\n",local_130);
    if (delim_pos == 0xffffffffffffffff) {
      extend.end._2_1_ = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_190,name,(allocator<char> *)((long)&extend.end + 3));
      std::operator+(&local_170,"Invalid test spec.",&local_190);
      std::operator+(&local_150,&local_170,": line terminator missing.");
      std::runtime_error::runtime_error(prVar7,(string *)&local_150);
      extend.end._2_1_ = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_130 = local_130 + 3;
    std::shared_ptr<mjs::source_file>::shared_ptr
              ((shared_ptr<mjs::source_file> *)local_1b0,(shared_ptr<mjs::source_file> *)local_b8);
    extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = (undefined4)next_pos;
    extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = (undefined4)delim_pos;
    source_extend::source_extend(&local_1f8.extend,(source_extend *)local_1b0);
    local_23a = 1;
    local_1f8.position = (uint32_t)local_130;
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (source_text,local_130,delim_pos - local_130);
    local_238 = bVar9;
    sVar10 = trim(&local_238);
    local_228 = sVar10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_218,&local_228,&local_239);
    parse_value(&local_1f8.expected,
                (gc_heap *)
                &specs.super__Vector_base<mjs::test_spec,_std::allocator<mjs::test_spec>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,&local_218);
    local_23a = 0;
    std::vector<mjs::test_spec,_std::allocator<mjs::test_spec>_>::push_back
              ((vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)
               &file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_1f8);
    test_spec::~test_spec(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_239);
    source_extend::~source_extend((source_extend *)local_1b0);
    next_pos = delim_pos + 1;
  } while( true );
}

Assistant:

void run_test_spec(const std::string_view& source_text, const std::string_view& name) {
    constexpr const char delim[] = "//$";
    constexpr const int delim_len = sizeof(delim)-1;


    gc_heap heap{1<<20};

    {
        std::vector<test_spec> specs;
        auto file = std::make_shared<source_file>(std::wstring(name.begin(), name.end()), std::wstring(source_text.begin(), source_text.end()), tested_version());

        for (size_t pos = 0, next_pos; pos < source_text.length(); pos = next_pos + 1) {
            size_t delim_pos = source_text.find(delim, pos);
            if (delim_pos == std::string_view::npos) {
                break;
            }
            next_pos = source_text.find("\n", delim_pos);
            if (next_pos == std::string_view::npos) {
                throw std::runtime_error("Invalid test spec." + std::string(name) + ": line terminator missing.");
            }

            delim_pos += delim_len;

            source_extend extend{file, static_cast<uint32_t>(pos), static_cast<uint32_t>(next_pos)};

            specs.push_back(test_spec{extend, static_cast<uint32_t>(delim_pos), parse_value(heap, std::string(trim(source_text.substr(delim_pos, next_pos - delim_pos))))});
        }

        if (specs.empty()) {
            throw std::runtime_error("Invalid test spec." + std::string(name) + ": No specs found");
        }

        auto bs = parse(file);
        const auto index = test_spec_runner::run(heap, specs, *bs);
        if (index != specs.size()) {
            throw std::runtime_error("Invalid test spec." + std::string(name) + ": Only " + std::to_string(index) + " of " + std::to_string(specs.size()) + " specs ran");
        }
    }

    heap.garbage_collect();
    if (heap.use_percentage()) {
        std::wostringstream oss;
        oss << "Leaks in test spec: " << heap.use_percentage() << "%\n" << std::wstring(source_text.begin(), source_text.end());
        THROW_RUNTIME_ERROR(oss.str());
    }

}